

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xxhash.h
# Opt level: O0

xxh_u64 XXH64_finalize(xxh_u64 h64,xxh_u8 *ptr,size_t len,XXH_alignment align)

{
  xxh_u32 xVar1;
  xxh_u64 xVar2;
  ulong uVar3;
  xxh_u64 k1;
  ulong uStack_20;
  XXH_alignment align_local;
  size_t len_local;
  xxh_u8 *ptr_local;
  xxh_u64 h64_local;
  
  len_local = (size_t)ptr;
  ptr_local = (xxh_u8 *)h64;
  for (uStack_20 = len & 0x1f; 7 < uStack_20; uStack_20 = uStack_20 - 8) {
    xVar2 = XXH_readLE64_align((void *)len_local,align);
    xVar2 = XXH64_round(0,xVar2);
    len_local = len_local + 8;
    ptr_local = (xxh_u8 *)
                (((xVar2 ^ (ulong)ptr_local) << 0x1b | (xVar2 ^ (ulong)ptr_local) >> 0x25) *
                 -0x61c8864e7a143579 + -0x7a1435883d4d519d);
  }
  if (3 < uStack_20) {
    xVar1 = XXH_readLE32_align((void *)len_local,align);
    uVar3 = (ulong)xVar1 * -0x61c8864e7a143579 ^ (ulong)ptr_local;
    len_local = len_local + 4;
    ptr_local = (xxh_u8 *)
                ((uVar3 << 0x17 | uVar3 >> 0x29) * -0x3d4d51c2d82b14b1 + 0x165667b19e3779f9);
    uStack_20 = uStack_20 - 4;
  }
  for (; uStack_20 != 0; uStack_20 = uStack_20 - 1) {
    uVar3 = (ulong)*(byte *)len_local * 0x27d4eb2f165667c5 ^ (ulong)ptr_local;
    ptr_local = (xxh_u8 *)((uVar3 << 0xb | uVar3 >> 0x35) * -0x61c8864e7a143579);
    len_local = len_local + 1;
  }
  xVar2 = XXH64_avalanche((xxh_u64)ptr_local);
  return xVar2;
}

Assistant:

static xxh_u64
XXH64_finalize(xxh_u64 h64, const xxh_u8* ptr, size_t len, XXH_alignment align)
{
    if (ptr==NULL) XXH_ASSERT(len == 0);
    len &= 31;
    while (len >= 8) {
        xxh_u64 const k1 = XXH64_round(0, XXH_get64bits(ptr));
        ptr += 8;
        h64 ^= k1;
        h64  = XXH_rotl64(h64,27) * XXH_PRIME64_1 + XXH_PRIME64_4;
        len -= 8;
    }
    if (len >= 4) {
        h64 ^= (xxh_u64)(XXH_get32bits(ptr)) * XXH_PRIME64_1;
        ptr += 4;
        h64 = XXH_rotl64(h64, 23) * XXH_PRIME64_2 + XXH_PRIME64_3;
        len -= 4;
    }
    while (len > 0) {
        h64 ^= (*ptr++) * XXH_PRIME64_5;
        h64 = XXH_rotl64(h64, 11) * XXH_PRIME64_1;
        --len;
    }
    return  XXH64_avalanche(h64);
}